

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::FatalConditionHandler::engage_platform(FatalConditionHandler *this)

{
  size_t i;
  sigaction sa;
  stack_t sigStack;
  ulong local_c0;
  sigaction local_b8;
  sigaltstack local_20;
  
  local_20.ss_sp = altStackMem;
  local_20.ss_size = altStackSize;
  local_20.ss_flags = 0;
  sigaltstack(&local_20,(sigaltstack *)oldSigStack);
  memset(&local_b8,0,0x98);
  local_b8.__sigaction_handler.sa_handler = handleSignal;
  local_b8.sa_flags = 0x8000000;
  for (local_c0 = 0; local_c0 < 6; local_c0 = local_c0 + 1) {
    sigaction((&signalDefs)[local_c0 * 4],&local_b8,(sigaction *)(oldSigActions + local_c0 * 0x98));
  }
  return;
}

Assistant:

void FatalConditionHandler::engage_platform() {
        stack_t sigStack;
        sigStack.ss_sp = altStackMem;
        sigStack.ss_size = altStackSize;
        sigStack.ss_flags = 0;
        sigaltstack(&sigStack, &oldSigStack);
        struct sigaction sa = { };

        sa.sa_handler = handleSignal;
        sa.sa_flags = SA_ONSTACK;
        for (std::size_t i = 0; i < sizeof(signalDefs)/sizeof(SignalDefs); ++i) {
            sigaction(signalDefs[i].id, &sa, &oldSigActions[i]);
        }
    }